

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

bool __thiscall adios2sys::Directory::FileIsSymlink(Directory *this,size_t i)

{
  bool bVar1;
  string *path;
  string local_38 [8];
  size_t in_stack_ffffffffffffffd0;
  Directory *in_stack_ffffffffffffffd8;
  
  GetFilePath_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = SystemTools::FileIsSymlink(path);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool Directory::FileIsSymlink(std::size_t i) const
{
  std::string const& path = this->GetFilePath(i);
#if defined(_WIN32) && !defined(__CYGWIN__)
  auto const& data = this->Internal->Files[i].FindData;
  return kwsys::SystemTools::FileIsSymlinkWithAttr(
    Encoding::ToWindowsExtendedPath(path), data.dwFileAttributes);
#else
  return kwsys::SystemTools::FileIsSymlink(path);
#endif
}